

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

unsigned_long __thiscall protozero::pbf_reader::get_fixed<unsigned_long>(pbf_reader *this)

{
  unsigned_long *puVar1;
  char *tmp_data;
  unsigned_long result;
  pbf_reader *this_local;
  
  puVar1 = (unsigned_long *)this->m_data;
  skip_bytes(this,8);
  return *puVar1;
}

Assistant:

T get_fixed() {
        T result;
        const char* tmp_data = m_data;
        skip_bytes(sizeof(T));
        std::memcpy(&result, tmp_data, sizeof(T));
#if PROTOZERO_BYTE_ORDER != PROTOZERO_LITTLE_ENDIAN
        byteswap_inplace(&result);
#endif
        return result;
    }